

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvtable.cc
# Opt level: O3

vector<board::Move,_std::allocator<board::Move>_> * __thiscall
search::PVTable::getPV
          (vector<board::Move,_std::allocator<board::Move>_> *__return_storage_ptr__,PVTable *this,
          Board *pos)

{
  pointer *ppMVar1;
  int iVar2;
  iterator __position;
  bool bVar3;
  const_iterator cVar4;
  int iVar5;
  Move local_40;
  uint64_t local_38;
  
  iVar2 = pos->ply;
  (__return_storage_ptr__->super__Vector_base<board::Move,_std::allocator<board::Move>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<board::Move,_std::allocator<board::Move>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<board::Move,_std::allocator<board::Move>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = 0x40;
  do {
    local_38 = pos->hashKey;
    cVar4 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_board::Move>,_std::allocator<std::pair<const_unsigned_long,_board::Move>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_board::Move>,_std::allocator<std::pair<const_unsigned_long,_board::Move>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)this,&local_38);
    if (((cVar4.super__Node_iterator_base<std::pair<const_unsigned_long,_board::Move>,_false>._M_cur
          == (__node_type *)0x0) ||
        (local_40 = *(Move *)((long)cVar4.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_board::Move>,_false>
                                    ._M_cur + 0x10), local_40.value == 0)) ||
       (bVar3 = board::makemove::move(&local_40,pos), !bVar3)) break;
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<board::Move,_std::allocator<board::Move>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<board::Move,_std::allocator<board::Move>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<board::Move,std::allocator<board::Move>>::_M_realloc_insert<board::Move_const&>
                ((vector<board::Move,std::allocator<board::Move>> *)__return_storage_ptr__,
                 __position,&local_40);
    }
    else {
      *__position._M_current = local_40;
      ppMVar1 = &(__return_storage_ptr__->
                 super__Vector_base<board::Move,_std::allocator<board::Move>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
    }
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  while (iVar2 < pos->ply) {
    board::makemove::undo(pos);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<board::Move> search::PVTable::getPV(board::Board& pos)
{
    int originalPly = pos.getPly();
    std::vector<board::Move> pv;
    for (int i = 0; i < 64; i++) {
        board::Move move = getMove(pos);
        if (move.getValue() != 0 && board::makemove::move(move, pos)) {
            pv.push_back(move);
        }
        else {
            break;
        }
    }
    while (pos.getPly() > originalPly) {
        board::makemove::undo(pos);
    }
    return pv;
}